

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DTest.cpp
# Opt level: O1

bool __thiscall DOMTest::testPI(DOMTest *this,DOMDocument *document)

{
  char cVar1;
  int iVar2;
  long *plVar3;
  DOMNode *pDVar4;
  XMLCh *pXVar5;
  wchar16 *pwVar6;
  wchar16 *pwVar7;
  long lVar8;
  DOMDocument *pDVar9;
  XMLCh *pXVar10;
  XMLCh *pXVar11;
  DOMDocument *pDVar12;
  DOMNode *pDVar13;
  DOMNode *pDVar14;
  bool bVar15;
  
  plVar3 = (long *)(**(code **)(*(long *)document + 0x68))(document);
  pDVar4 = (DOMNode *)(**(code **)(*plVar3 + 0x38))(plVar3);
  pXVar5 = (XMLCh *)(**(code **)(*(long *)pDVar4 + 0x68))(pDVar4,1);
  pwVar6 = (wchar16 *)(**(code **)(*(long *)pDVar4 + 0x10))(pDVar4);
  pwVar7 = (wchar16 *)(**(code **)(*(long *)pXVar5 + 0x10))(pXVar5);
  iVar2 = xercesc_4_0::XMLString::compareString(pwVar6,pwVar7);
  if (((iVar2 == 0) && (lVar8 = (**(code **)(*(long *)pDVar4 + 0x18))(pDVar4), lVar8 != 0)) &&
     (lVar8 = (**(code **)(*(long *)pXVar5 + 0x18))(pXVar5), lVar8 != 0)) {
    pwVar6 = (wchar16 *)(**(code **)(*(long *)pDVar4 + 0x18))(pDVar4);
    pwVar7 = (wchar16 *)(**(code **)(*(long *)pXVar5 + 0x18))(pXVar5);
    iVar2 = xercesc_4_0::XMLString::compareString(pwVar6,pwVar7);
    bVar15 = true;
    if (iVar2 == 0) goto LAB_00116792;
  }
  else {
    lVar8 = (**(code **)(*(long *)pDVar4 + 0x18))(pDVar4);
    if (lVar8 == 0) {
      lVar8 = (**(code **)(*(long *)pXVar5 + 0x18))(pXVar5);
      bVar15 = true;
      if (lVar8 == 0) goto LAB_00116792;
    }
  }
  testPI();
  bVar15 = false;
LAB_00116792:
  xercesc_4_0::XMLString::transcode
            ("This is #document\'s processing instruction",tempStr,3999,
             xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  pwVar6 = (wchar16 *)(**(code **)(*(long *)pDVar4 + 0x148))(pDVar4);
  iVar2 = xercesc_4_0::XMLString::compareString(tempStr,pwVar6);
  if (iVar2 != 0) {
    testPI();
    bVar15 = false;
  }
  xercesc_4_0::XMLString::transcode
            ("PI\'s reset data",tempStr,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  (**(code **)(*(long *)pDVar4 + 0x150))(pDVar4,tempStr);
  pwVar6 = (wchar16 *)(**(code **)(*(long *)pDVar4 + 0x148))(pDVar4);
  iVar2 = xercesc_4_0::XMLString::compareString(tempStr,pwVar6);
  if (iVar2 != 0) {
    testPI();
    bVar15 = false;
  }
  xercesc_4_0::XMLString::transcode
            ("dTargetProcessorChannel",tempStr,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  pwVar6 = (wchar16 *)(**(code **)(*(long *)pDVar4 + 0x140))(pDVar4);
  iVar2 = xercesc_4_0::XMLString::compareString(tempStr,pwVar6);
  if (iVar2 != 0) {
    testPI();
    bVar15 = false;
  }
  xercesc_4_0::XMLString::transcode
            ("This is #document\'s processing instruction",tempStr,3999,
             xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  (**(code **)(*(long *)pDVar4 + 0x150))(pDVar4,tempStr);
  xercesc_4_0::XMLString::transcode
            ("first",tempStr,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  xercesc_4_0::XMLString::transcode
            ("document",tempStr2,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  (**(code **)(*(long *)pDVar4 + 0xe8))(pDVar4,tempStr2,document,0);
  pDVar9 = (DOMDocument *)(**(code **)(*(long *)pDVar4 + 0xf0))(pDVar4,tempStr2);
  if (pDVar9 != document) {
    testPI();
    bVar15 = false;
  }
  (**(code **)(*(long *)pDVar4 + 0xe8))(pDVar4,tempStr,pXVar5,0);
  pXVar10 = (XMLCh *)(**(code **)(*(long *)pDVar4 + 0xf0))(pDVar4,tempStr);
  if (pXVar5 != pXVar10) {
    testPI();
    bVar15 = false;
  }
  pXVar10 = (XMLCh *)(**(code **)(*(long *)pDVar4 + 0xe8))(pDVar4,tempStr,tempStr2,0);
  pXVar11 = (XMLCh *)(**(code **)(*(long *)pDVar4 + 0xf0))(pDVar4,tempStr);
  if (pXVar11 != tempStr2) {
    testPI();
    bVar15 = false;
  }
  if (pXVar5 != pXVar10) {
    testPI();
    bVar15 = false;
  }
  if (pXVar5 == pXVar11) {
    testPI();
    bVar15 = false;
  }
  xercesc_4_0::XMLString::transcode
            ("not-exist",tempStr3,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  lVar8 = (**(code **)(*(long *)pDVar4 + 0xf0))(pDVar4,tempStr3);
  if (lVar8 != 0) {
    testPI();
    bVar15 = false;
  }
  lVar8 = (**(code **)(*(long *)pXVar5 + 0xf0))(pXVar5,tempStr);
  if (lVar8 != 0) {
    testPI();
    bVar15 = false;
  }
  pXVar10 = (XMLCh *)(**(code **)(*(long *)pDVar4 + 0xe8))(pDVar4,tempStr,0,0);
  lVar8 = (**(code **)(*(long *)pDVar4 + 0xf0))(pDVar4,tempStr);
  if (pXVar10 != tempStr2) {
    testPI();
    bVar15 = false;
  }
  if (lVar8 != 0) {
    testPI();
    bVar15 = false;
  }
  pDVar12 = (DOMDocument *)(**(code **)(*(long *)pDVar4 + 0xe8))(pDVar4,tempStr2,0,0);
  lVar8 = (**(code **)(*(long *)pDVar4 + 0xf0))(pDVar4,tempStr2);
  if (pDVar9 != pDVar12) {
    testPI();
    bVar15 = false;
  }
  if (lVar8 != 0) {
    testPI();
    bVar15 = false;
  }
  lVar8 = (**(code **)(*(long *)pDVar4 + 0xf0))(pDVar4,tempStr);
  if (lVar8 != 0) {
    testPI();
    bVar15 = false;
  }
  lVar8 = (**(code **)(*(long *)pDVar4 + 0xf0))(pDVar4,tempStr2);
  if (lVar8 != 0) {
    testPI();
    bVar15 = false;
  }
  (**(code **)(*(long *)pDVar4 + 0xe8))(pDVar4,tempStr2,document,&userhandler);
  pDVar13 = (DOMNode *)(**(code **)(*(long *)pDVar4 + 0x68))(pDVar4,1);
  if (userhandler.currentType != NODE_CLONED) {
    testPI();
    bVar15 = false;
  }
  iVar2 = xercesc_4_0::XMLString::compareString(userhandler.currentKey,tempStr2);
  if (iVar2 != 0) {
    testPI();
    bVar15 = false;
  }
  if ((DOMDocument *)userhandler.currentData != document) {
    testPI();
    bVar15 = false;
  }
  if (userhandler.currentSrc != pDVar4) {
    testPI();
    bVar15 = false;
  }
  if (userhandler.currentDst != pDVar13) {
    testPI();
    bVar15 = false;
  }
  (**(code **)(*(long *)(document + 0x18) + 0xe8))(document + 0x18,tempStr2,document,&userhandler);
  pDVar14 = (DOMNode *)(**(code **)(*(long *)document + 0x78))(document,pDVar4,1);
  if (userhandler.currentType != NODE_IMPORTED) {
    testPI();
    bVar15 = false;
  }
  iVar2 = xercesc_4_0::XMLString::compareString(userhandler.currentKey,tempStr2);
  if (iVar2 != 0) {
    testPI();
    bVar15 = false;
  }
  if ((DOMDocument *)userhandler.currentData != document) {
    testPI();
    bVar15 = false;
  }
  if (userhandler.currentSrc != pDVar4) {
    testPI();
    bVar15 = false;
  }
  if (userhandler.currentDst != pDVar14) {
    testPI();
    bVar15 = false;
  }
  (**(code **)(*(long *)pDVar14 + 0xe8))(pDVar14,tempStr2,pDVar4,&userhandler);
  (**(code **)(*(long *)pDVar14 + 0x138))(pDVar14);
  if (userhandler.currentType != NODE_DELETED) {
    testPI();
    bVar15 = false;
  }
  iVar2 = xercesc_4_0::XMLString::compareString(userhandler.currentKey,tempStr2);
  if (iVar2 != 0) {
    testPI();
    bVar15 = false;
  }
  if ((DOMNode *)userhandler.currentData != pDVar4) {
    testPI();
    bVar15 = false;
  }
  if (userhandler.currentSrc != (DOMNode *)0x0) {
    testPI();
    bVar15 = false;
  }
  if (userhandler.currentDst != (DOMNode *)0x0) {
    testPI();
    bVar15 = false;
  }
  cVar1 = (**(code **)(*(long *)pDVar4 + 0xd8))(pDVar4,pDVar4);
  if (cVar1 == '\0') {
    testPI();
    bVar15 = false;
  }
  cVar1 = (**(code **)(*(long *)pDVar4 + 0xd8))(pDVar4,pXVar5);
  if (cVar1 != '\0') {
    testPI();
    bVar15 = false;
  }
  cVar1 = (**(code **)(*(long *)pDVar4 + 0xe0))(pDVar4,pDVar13);
  if (cVar1 == '\0') {
    testPI();
    bVar15 = false;
  }
  cVar1 = (**(code **)(*(long *)pDVar4 + 0xe0))(pDVar4,pDVar4);
  if (cVar1 == '\0') {
    testPI();
    bVar15 = false;
  }
  cVar1 = (**(code **)(*(long *)pDVar4 + 0xe0))(pDVar4,document + 0x18);
  if (cVar1 != '\0') {
    testPI();
    bVar15 = false;
  }
  (**(code **)(*(long *)document + 0xf0))(document,pDVar4,0,tempStr2);
  testPI();
  if (bVar15 == false) {
    puts("\n*****The PI method calls listed above failed, all others worked correctly.*****");
  }
  return bVar15;
}

Assistant:

bool DOMTest::testPI(DOMDocument* document)
{
    DOMProcessingInstruction* pI, *pI2;
    bool OK = true;
// For debugging*****   printf("\n          testPI's outputs:\n");
	DOMNode*   abc50 = document->getDocumentElement()->getFirstChild();// Get doc's DOMProcessingInstruction
    pI  = (DOMProcessingInstruction*) abc50;
	DOMNode*   abc51 = pI->cloneNode(true);//*****?
    pI2 = (DOMProcessingInstruction*) abc51;
    // Check nodes for equality, both their name and value or lack thereof
    if (!(!XMLString::compareString(pI->getNodeName(), pI2->getNodeName()) &&         // Compares node names for equality
         (pI->getNodeValue() != 0 && pI2->getNodeValue() != 0)  // Checks to make sure each node has a value node
        ? !XMLString::compareString(pI->getNodeValue(), pI2->getNodeValue())      // If both have value nodes test those value nodes for equality
        :(pI->getNodeValue() == 0 && pI2->getNodeValue() == 0)))// If one node doesn't have a value node make sure both don't
    {
        fprintf(stderr, "'cloneNode' did not clone the DOMEntity* node correctly\n");
        OK = false;
    }
    // Deep clone test comparison is in testNode & testDocument
    // compare = "This is [#document: 0]'s processing instruction";  // AH Revisit.  Where id
    //                  this ": 0]" stuff come from in the Java version??  I don' think that it is right.
    XMLString::transcode("This is #document's processing instruction", tempStr, 3999);
    if (XMLString::compareString(tempStr, pI->getData()))
    {
        fprintf(stderr, "Warning!!! PI's 'getData' failed!\n");
        OK = false;
    }

    XMLString::transcode("PI's reset data", tempStr, 3999);
    pI->setData(tempStr);
    if (XMLString::compareString(tempStr, pI->getData()))
    {
        fprintf(stderr, "Warning!!! PI's 'setData' failed!\n");
        OK = false;
    }
    XMLString::transcode("dTargetProcessorChannel", tempStr, 3999);
    if (XMLString::compareString(tempStr, pI->getTarget()))
    {
        fprintf(stderr, "Warning!!! PI's 'getTarget' failed!\n");
        OK = false;
    }


    // Restore original PI data.
    XMLString::transcode("This is #document's processing instruction", tempStr, 3999);
    pI->setData(tempStr);

    // Test the user data
    // Test simple set and get
    DOMProcessingInstruction* userTest = pI;
    DOMNode*  userFirst = abc51;
    XMLCh* userSecond = tempStr2;
    XMLString::transcode("first", tempStr, 3999);

    XMLString::transcode("document", tempStr2, 3999);
    userTest->setUserData(tempStr2, (void*) document, 0);
    void* mydocument = userTest->getUserData(tempStr2);
    if (document != mydocument) {
        fprintf(stderr, "'set/getUserData' in line %i does not work\n", __LINE__);
        OK = false;
    }

    userTest->setUserData(tempStr, (void*) userFirst, 0);
    void* myFirst = userTest->getUserData(tempStr);
    if (userFirst != myFirst) {
        fprintf(stderr, "'set/getUserData' in line %i does not work\n", __LINE__);
        OK = false;
    }

    // Test overwrite
    void* myFirst2 = userTest->setUserData(tempStr, (void*) userSecond, 0);
    void* mySecond = userTest->getUserData(tempStr);
    if (userSecond != mySecond) {
        fprintf(stderr, "overwrite userdata with same key in line %i does not work\n", __LINE__);
        OK = false;
    }
    if (userFirst != myFirst2) {
        fprintf(stderr, "overwrite userdata with same key in line %i does not work\n", __LINE__);
        OK = false;
    }
    if (userFirst == mySecond) {
        fprintf(stderr, "overwrite userdata with same key in line %i does not work\n", __LINE__);
        OK = false;
    }

    // Test null
    // test non-exist key
    XMLString::transcode("not-exist", tempStr3, 3999);
    if (userTest->getUserData(tempStr3)) {
        fprintf(stderr, "get non-exist user data in line %i does not work\n", __LINE__);
        OK = false;
    }

    // use a node that does not have user data set before
    if (abc51->getUserData(tempStr)) {
        fprintf(stderr, "get non-exist user data in line %i does not work\n", __LINE__);
        OK = false;
    }

    // Test reset(reset)
    void* mySecond2 = userTest->setUserData(tempStr, (void*) 0, 0);
    void* myNull = userTest->getUserData(tempStr);
    if (userSecond != mySecond2) {
        fprintf(stderr, "overwrite userdata with same key in line %i does not work\n", __LINE__);
        OK = false;
    }
    if (myNull) {
        fprintf(stderr, "overwrite userdata with same key in line %i does not work\n", __LINE__);
        OK = false;
    }

    void* mydocument2 = userTest->setUserData(tempStr2, (void*) 0, 0);
    void* myNull2 = userTest->getUserData(tempStr2);
    if (mydocument != mydocument2) {
        fprintf(stderr, "overwrite userdata with same key in line %i does not work\n", __LINE__);
        OK = false;
    }
    if (myNull2) {
        fprintf(stderr, "overwrite userdata with same key in line %i does not work\n", __LINE__);
        OK = false;
    }

    //the userTest user data table should be null now
    if (userTest->getUserData(tempStr)) {
        fprintf(stderr, "get non-exist user data in line %i does not work\n", __LINE__);
        OK = false;
    }
    if (userTest->getUserData(tempStr2)) {
        fprintf(stderr, "get non-exist user data in line %i does not work\n", __LINE__);
        OK = false;
    }

    // Test DOMUserDataHandler
    // test clone
    userTest->setUserData(tempStr2, (void*) document, &userhandler);
    DOMNode* mycloned = userTest->cloneNode(true);
    USERDATAHANDLERTEST(userhandler, DOMUserDataHandler::NODE_CLONED, tempStr2, document, userTest, mycloned, __LINE__);

    // test import
    document->setUserData(tempStr2, (void*) document, &userhandler);
    DOMNode* myimport = document->importNode(userTest,true);
    USERDATAHANDLERTEST(userhandler, DOMUserDataHandler::NODE_IMPORTED, tempStr2, document, userTest, myimport, __LINE__);

    // test delete
    myimport->setUserData(tempStr2, (void*) userTest, &userhandler);
    myimport->release();
    USERDATAHANDLERTEST(userhandler, DOMUserDataHandler::NODE_DELETED, tempStr2, userTest, 0, 0, __LINE__);

    // Test isSameNode
    if (!userTest->isSameNode(userTest)) {
        fprintf(stderr, "isSameNode failed in line %i\n", __LINE__);
        OK = false;
    }
    if (userTest->isSameNode(userFirst)) {
        fprintf(stderr, "isSameNode failed in line %i\n", __LINE__);
        OK = false;
    }

    // Test isEqualNode
    if (!userTest->isEqualNode(mycloned)) {
        fprintf(stderr, "isEqualNode failed in line %i\n", __LINE__);
        OK = false;
    }

    if (!userTest->isEqualNode(userTest)) {
        fprintf(stderr, "isEqualNode failed in line %i\n", __LINE__);
        OK = false;
    }
    if (userTest->isEqualNode(document)) {
        fprintf(stderr, "isEqualNode failed in line %i\n", __LINE__);
        OK = false;
    }

    // Test rename, should throw exception
    EXCEPTIONSTEST(document->renameNode(userTest, 0, tempStr2), DOMException::NOT_SUPPORTED_ERR, OK, 213 );

    if (!OK)
        printf("\n*****The PI method calls listed above failed, all others worked correctly.*****\n");

    return OK;
}